

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_attention.h
# Opt level: O1

void __thiscall
shift_window_transformer::WindowAttention<float>::~WindowAttention
          (WindowAttention<float> *this,void **vtt)

{
  void *pvVar1;
  Linear<float> *pLVar2;
  Tensor<float> *pTVar3;
  pointer piVar4;
  pointer pfVar5;
  Tensor<int> *pTVar6;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x28)) = vtt[1];
  pLVar2 = this->qLinear;
  if (pLVar2 != (Linear<float> *)0x0) {
    Linear<float>::~Linear(pLVar2);
    operator_delete(pLVar2,0x28);
    this->qLinear = (Linear<float> *)0x0;
  }
  pLVar2 = this->kLinear;
  if (pLVar2 != (Linear<float> *)0x0) {
    Linear<float>::~Linear(pLVar2);
    operator_delete(pLVar2,0x28);
    this->kLinear = (Linear<float> *)0x0;
  }
  pLVar2 = this->vLinear;
  if (pLVar2 != (Linear<float> *)0x0) {
    Linear<float>::~Linear(pLVar2);
    operator_delete(pLVar2,0x28);
    this->vLinear = (Linear<float> *)0x0;
  }
  pLVar2 = this->outLinear;
  if (pLVar2 != (Linear<float> *)0x0) {
    Linear<float>::~Linear(pLVar2);
    operator_delete(pLVar2,0x28);
    this->outLinear = (Linear<float> *)0x0;
  }
  pTVar3 = this->upperLowerMask;
  if (pTVar3 != (Tensor<float> *)0x0) {
    piVar4 = (pTVar3->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar4 != (pointer)0x0) {
      operator_delete(piVar4,(long)(pTVar3->shape).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar4)
      ;
    }
    pfVar5 = (pTVar3->super_vector<float,_std::allocator<float>_>).
             super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (pfVar5 != (pointer)0x0) {
      operator_delete(pfVar5,(long)(pTVar3->super_vector<float,_std::allocator<float>_>).
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)pfVar5);
    }
    operator_delete(pTVar3,0x30);
    this->upperLowerMask = (Tensor<float> *)0x0;
  }
  pTVar3 = this->leftRightMask;
  if (pTVar3 != (Tensor<float> *)0x0) {
    piVar4 = (pTVar3->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar4 != (pointer)0x0) {
      operator_delete(piVar4,(long)(pTVar3->shape).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar4)
      ;
    }
    pfVar5 = (pTVar3->super_vector<float,_std::allocator<float>_>).
             super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (pfVar5 != (pointer)0x0) {
      operator_delete(pfVar5,(long)(pTVar3->super_vector<float,_std::allocator<float>_>).
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)pfVar5);
    }
    operator_delete(pTVar3,0x30);
    this->leftRightMask = (Tensor<float> *)0x0;
  }
  pTVar6 = this->relativeIndices;
  if (pTVar6 != (Tensor<int> *)0x0) {
    piVar4 = (pTVar6->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar4 != (pointer)0x0) {
      operator_delete(piVar4,(long)(pTVar6->shape).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar4)
      ;
    }
    piVar4 = (pTVar6->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if (piVar4 != (pointer)0x0) {
      operator_delete(piVar4,(long)(pTVar6->super_vector<int,_std::allocator<int>_>).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)piVar4);
    }
    operator_delete(pTVar6,0x30);
    this->relativeIndices = (Tensor<int> *)0x0;
  }
  pTVar3 = this->posEmbedding;
  if (pTVar3 != (Tensor<float> *)0x0) {
    piVar4 = (pTVar3->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar4 != (pointer)0x0) {
      operator_delete(piVar4,(long)(pTVar3->shape).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar4)
      ;
    }
    pfVar5 = (pTVar3->super_vector<float,_std::allocator<float>_>).
             super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (pfVar5 != (pointer)0x0) {
      operator_delete(pfVar5,(long)(pTVar3->super_vector<float,_std::allocator<float>_>).
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)pfVar5);
    }
    operator_delete(pTVar3,0x30);
    this->posEmbedding = (Tensor<float> *)0x0;
  }
  if (this->cyclicShift != (CyclicShift<float> *)0x0) {
    operator_delete(this->cyclicShift,0x10);
    this->cyclicShift = (CyclicShift<float> *)0x0;
  }
  if (this->cyclicBackShift != (CyclicShift<float> *)0x0) {
    operator_delete(this->cyclicBackShift,0x10);
    this->cyclicBackShift = (CyclicShift<float> *)0x0;
  }
  return;
}

Assistant:

~WindowAttention() {
            if (qLinear != nullptr) {
                delete qLinear;
                qLinear = nullptr;
            }
            if (kLinear != nullptr) {
                delete kLinear;
                kLinear = nullptr;
            }
            if (vLinear != nullptr) {
                delete vLinear;
                vLinear = nullptr;
            }
            if (outLinear != nullptr) {
                delete outLinear;
                outLinear = nullptr;
            }
            if (upperLowerMask != nullptr) {
                delete upperLowerMask;
                upperLowerMask = nullptr;
            }
            if (leftRightMask != nullptr) {
                delete leftRightMask;
                leftRightMask = nullptr;
            }
            if (relativeIndices != nullptr) {
                delete relativeIndices;
                relativeIndices = nullptr;
            }
            if (posEmbedding != nullptr) {
                delete posEmbedding;
                posEmbedding = nullptr;
            }
            if (cyclicShift != nullptr) {
                delete cyclicShift;
                cyclicShift = nullptr;
            }
            if (cyclicBackShift != nullptr) {
                delete cyclicBackShift;
                cyclicBackShift = nullptr;
            }
        }